

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O3

void Msat_ClauseRemoveWatch(Msat_ClauseVec_t *vClauses,Msat_Clause_t *pC)

{
  long lVar1;
  uint uVar2;
  Msat_Clause_t **ppMVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar2 = Msat_ClauseVecReadSize(vClauses);
  ppMVar3 = Msat_ClauseVecReadArray(vClauses);
  if (*ppMVar3 == pC) {
    uVar5 = 0;
  }
  else {
    uVar7 = 0;
    uVar6 = 0;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    do {
      if (uVar7 == uVar6) {
        __assert_fail("i < nClauses",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                      ,0x1c3,"void Msat_ClauseRemoveWatch(Msat_ClauseVec_t *, Msat_Clause_t *)");
      }
      uVar5 = uVar6 + 1;
      lVar1 = uVar6 + 1;
      uVar6 = uVar5;
    } while (ppMVar3[lVar1] != pC);
  }
  if ((int)uVar5 < (int)(uVar2 - 1)) {
    ppMVar3 = ppMVar3 + (uVar5 & 0xffffffff);
    do {
      *ppMVar3 = ppMVar3[1];
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
      ppMVar3 = ppMVar3 + 1;
    } while ((int)uVar4 < (int)(uVar2 - 1));
  }
  Msat_ClauseVecPop(vClauses);
  return;
}

Assistant:

void Msat_ClauseRemoveWatch( Msat_ClauseVec_t * vClauses, Msat_Clause_t * pC )
{
    Msat_Clause_t ** pClauses;
    int nClauses, i;
    nClauses = Msat_ClauseVecReadSize( vClauses );
    pClauses = Msat_ClauseVecReadArray( vClauses );
    for ( i = 0; pClauses[i] != pC; i++ )
        assert( i < nClauses );
    for (      ; i < nClauses - 1; i++ )
        pClauses[i] = pClauses[i+1];
    Msat_ClauseVecPop( vClauses );
}